

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

void pybind11::detail::traverse_offset_bases
               (void *valueptr,type_info *tinfo,instance *self,_func_bool_void_ptr_instance_ptr *f)

{
  bool bVar1;
  reference ppVar2;
  instance *in_RCX;
  type_info *in_RDX;
  long *in_RSI;
  __normal_iterator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
  *in_RDI;
  void *parentptr;
  pair<const_std::type_info_*,_void_*(*)(void_*)> *c;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
  *__range4;
  type_info *parent_tinfo;
  handle h;
  tuple_iterator __end2;
  tuple_iterator __begin2;
  tuple *__range2;
  PyTypeObject *in_stack_ffffffffffffff28;
  __normal_iterator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
  *in_stack_ffffffffffffff30;
  handle in_stack_ffffffffffffff38;
  __normal_iterator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
  local_78;
  vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
  *local_70;
  type_info *local_68;
  handle local_60;
  sequence_fast_readonly local_58;
  sequence_fast_readonly local_40;
  handle local_38;
  undefined1 local_30 [8];
  _func_bool_void_ptr_instance_ptr *f_00;
  
  pybind11::handle::handle(&local_38,*(PyObject **)(*in_RSI + 0x150));
  f_00 = (_func_bool_void_ptr_instance_ptr *)local_30;
  reinterpret_borrow<pybind11::tuple>(in_stack_ffffffffffffff38);
  local_40.ptr = (PyObject **)tuple::begin((tuple *)in_stack_ffffffffffffff28);
  local_58.ptr = (PyObject **)tuple::end((tuple *)in_stack_ffffffffffffff38.m_ptr);
  do {
    bVar1 = operator!=((It *)in_stack_ffffffffffffff30,(It *)in_stack_ffffffffffffff28);
    if (!bVar1) {
      tuple::~tuple((tuple *)0x15deb1);
      return;
    }
    local_60.m_ptr =
         (PyObject *)
         generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::operator*
                   ((generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly> *
                    )in_stack_ffffffffffffff28);
    pybind11::handle::ptr(&local_60);
    local_68 = get_type_info(in_stack_ffffffffffffff28);
    if (local_68 != (type_info *)0x0) {
      local_70 = &local_68->implicit_casts;
      local_78._M_current =
           (pair<const_std::type_info_*,_void_*(*)(void_*)> *)
           std::
           vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
           ::begin((vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
                    *)in_stack_ffffffffffffff28);
      std::
      vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
      ::end((vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
             *)in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               (in_stack_ffffffffffffff30,
                                (__normal_iterator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
                                 *)in_stack_ffffffffffffff28), bVar1) {
        ppVar2 = __gnu_cxx::
                 __normal_iterator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
                 ::operator*(&local_78);
        if (ppVar2->first == (type_info *)in_RSI[1]) {
          in_stack_ffffffffffffff30 =
               (__normal_iterator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
                *)(*ppVar2->second)(in_RDI);
          if (in_stack_ffffffffffffff30 != in_RDI) {
            (*(code *)in_RCX)(in_stack_ffffffffffffff30,in_RDX);
          }
          traverse_offset_bases(in_RSI,in_RDX,in_RCX,f_00);
          break;
        }
        __gnu_cxx::
        __normal_iterator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_*,_std::vector<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>_>
        ::operator++(&local_78);
      }
    }
    generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly>::operator++
              ((generic_iterator<pybind11::detail::iterator_policies::sequence_fast_readonly> *)
               in_stack_ffffffffffffff30);
  } while( true );
}

Assistant:

inline void traverse_offset_bases(void *valueptr, const detail::type_info *tinfo, instance *self,
        bool (*f)(void * /*parentptr*/, instance * /*self*/)) {
    for (handle h : reinterpret_borrow<tuple>(tinfo->type->tp_bases)) {
        if (auto parent_tinfo = get_type_info((PyTypeObject *) h.ptr())) {
            for (auto &c : parent_tinfo->implicit_casts) {
                if (c.first == tinfo->cpptype) {
                    auto *parentptr = c.second(valueptr);
                    if (parentptr != valueptr)
                        f(parentptr, self);
                    traverse_offset_bases(parentptr, parent_tinfo, self, f);
                    break;
                }
            }
        }
    }
}